

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Gemm_x86_avx::forward
          (Gemm_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  Mat *this_00;
  size_t sVar2;
  void *pvVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  Mat *pMVar16;
  Mat *pMVar17;
  ulong uVar18;
  int iVar19;
  uint broadcast_type_C;
  int *piVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  size_t sVar26;
  int iVar27;
  int iVar28;
  bool bVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  int TILE_N;
  int TILE_M;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  Mat local_1c8;
  ulong local_180;
  ulong local_178;
  Mat *local_170;
  Mat *local_168;
  ulong local_160;
  Mat local_158;
  long local_108;
  int TILE_K;
  Mat local_f8;
  ulong local_a8;
  Mat *local_a0;
  ulong local_98;
  ulong local_90;
  int TILE_M_2;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  int local_78;
  undefined4 uStack_74;
  int local_70;
  Allocator *local_68;
  int iStack_60;
  uint uStack_5c;
  int iStack_58;
  undefined8 uStack_54;
  ulong local_48;
  ulong local_38;
  
  if ((this->super_Gemm).int8_scale_term != 0) {
    iVar8 = forward_int8(this,bottom_blobs,top_blobs,opt);
    return iVar8;
  }
  iVar8 = (this->super_Gemm).constantA;
  iVar12 = (this->super_Gemm).constantB;
  if (iVar12 != 0 && iVar8 != 0) {
    uVar9 = (this->super_Gemm).constantM;
LAB_004ddfd4:
    uVar24 = (this->super_Gemm).constantN;
  }
  else {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar8 == 0) {
      iVar27 = (this->super_Gemm).transA;
      if (iVar12 != 0) {
        if (iVar27 == 0) {
          uVar9 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
        }
        else {
          uVar9 = pMVar1->w;
        }
        goto LAB_004ddfd4;
      }
      if (iVar27 == 0) {
        uVar9 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
      else {
        uVar9 = pMVar1->w;
      }
      if ((this->super_Gemm).transB == 0) {
        uVar24 = pMVar1[1].w;
      }
      else {
        uVar24 = pMVar1[1].elempack * (&pMVar1[1].h)[(ulong)(pMVar1[1].dims == 3) * 2];
      }
    }
    else {
      uVar9 = (this->super_Gemm).constantM;
      if ((this->super_Gemm).transB == 0) {
        uVar24 = pMVar1->w;
      }
      else {
        uVar24 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
    }
  }
  local_1c8.cstep = 0;
  uVar30 = 0;
  uVar31 = 0;
  local_1c8.data = (void *)0x0;
  local_1c8.refcount._0_4_ = 0;
  local_1c8.refcount._4_4_ = 0;
  local_1c8.elemsize._0_4_ = 0;
  local_1c8.elemsize._4_4_ = 0;
  local_1c8.elempack = 0;
  local_1c8.allocator = (Allocator *)0x0;
  local_1c8.dims = 0;
  local_1c8.w = 0;
  local_1c8.h = 0;
  local_1c8.d = 0;
  local_1c8.c = 0;
  if ((this->super_Gemm).constantC == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar22 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar1;
    if (iVar12 != 0 && iVar8 != 0) {
      bVar29 = true;
      if (lVar22 == 0x48) {
        local_1c8.data = pMVar1->data;
        piVar20 = pMVar1->refcount;
        sVar26 = pMVar1->elemsize;
        local_1c8.elempack = pMVar1->elempack;
        local_1c8.allocator = pMVar1->allocator;
        uVar30._0_4_ = pMVar1->dims;
        uVar30._4_4_ = pMVar1->w;
        uVar31._0_4_ = pMVar1->h;
        uVar31._4_4_ = pMVar1->d;
        local_1c8.c = pMVar1->c;
        local_1c8.cstep = pMVar1->cstep;
        if (piVar20 == (int *)0x0) {
          piVar20 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
          bVar29 = false;
        }
      }
      else {
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.elempack = 0;
        sVar26 = 0;
        piVar20 = (int *)0x0;
        local_1c8.data = (void *)0x0;
        local_1c8.c = 0;
        local_1c8.cstep = 0;
      }
      local_1c8.refcount._0_4_ = SUB84(piVar20,0);
      local_1c8.refcount._4_4_ = (uint)((ulong)piVar20 >> 0x20);
      local_1c8.elemsize._0_4_ = (int)sVar26;
      local_1c8.elemsize._4_4_ = (undefined4)(sVar26 >> 0x20);
      local_1c8.dims = (int)uVar30;
      local_1c8.w = (int)((ulong)uVar30 >> 0x20);
      local_1c8.h = (int)uVar31;
      local_1c8.d = (int)((ulong)uVar31 >> 0x20);
      if (!bVar29) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) goto LAB_004dfdd7;
          (*(local_1c8.allocator)->_vptr_Allocator[3])(local_1c8.allocator,local_1c8.data);
        }
      }
    }
    else if (iVar8 == 0) {
      if (iVar12 == 0) {
        bVar29 = true;
        if (lVar22 == 0xd8) {
          local_1c8.data = pMVar1[2].data;
          piVar20 = pMVar1[2].refcount;
          sVar26 = pMVar1[2].elemsize;
          local_1c8.elempack = pMVar1[2].elempack;
          local_1c8.allocator = pMVar1[2].allocator;
          uVar30._0_4_ = pMVar1[2].dims;
          uVar30._4_4_ = pMVar1[2].w;
          uVar31._0_4_ = pMVar1[2].h;
          uVar31._4_4_ = pMVar1[2].d;
          local_1c8.c = pMVar1[2].c;
          local_1c8.cstep = pMVar1[2].cstep;
          if (piVar20 == (int *)0x0) {
            piVar20 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
            bVar29 = false;
          }
        }
        else {
          local_1c8.cstep = 0;
          local_1c8.c = 0;
          local_1c8.allocator = (Allocator *)0x0;
          local_1c8.elempack = 0;
          sVar26 = 0;
          piVar20 = (int *)0x0;
          local_1c8.data = (void *)0x0;
        }
        local_1c8.refcount._0_4_ = SUB84(piVar20,0);
        local_1c8.refcount._4_4_ = (uint)((ulong)piVar20 >> 0x20);
        local_1c8.elemsize._0_4_ = (int)sVar26;
        local_1c8.elemsize._4_4_ = (undefined4)(sVar26 >> 0x20);
        local_1c8.dims = (int)uVar30;
        local_1c8.w = (int)((ulong)uVar30 >> 0x20);
        local_1c8.h = (int)uVar31;
        local_1c8.d = (int)((ulong)uVar31 >> 0x20);
        if (!bVar29) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_1c8.allocator == (Allocator *)0x0) goto LAB_004dfdd7;
            (*(local_1c8.allocator)->_vptr_Allocator[3])(local_1c8.allocator,local_1c8.data);
          }
        }
      }
      else {
        bVar29 = true;
        if (lVar22 == 0x90) {
          local_1c8.data = pMVar1[1].data;
          piVar20 = pMVar1[1].refcount;
          sVar26 = pMVar1[1].elemsize;
          local_1c8.elempack = pMVar1[1].elempack;
          local_1c8.allocator = pMVar1[1].allocator;
          uVar30._0_4_ = pMVar1[1].dims;
          uVar30._4_4_ = pMVar1[1].w;
          uVar31._0_4_ = pMVar1[1].h;
          uVar31._4_4_ = pMVar1[1].d;
          local_1c8.c = pMVar1[1].c;
          local_1c8.cstep = pMVar1[1].cstep;
          if (piVar20 == (int *)0x0) {
            piVar20 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
            bVar29 = false;
          }
        }
        else {
          local_1c8.cstep = 0;
          local_1c8.c = 0;
          local_1c8.allocator = (Allocator *)0x0;
          local_1c8.elempack = 0;
          sVar26 = 0;
          piVar20 = (int *)0x0;
          local_1c8.data = (void *)0x0;
        }
        local_1c8.refcount._0_4_ = SUB84(piVar20,0);
        local_1c8.refcount._4_4_ = (uint)((ulong)piVar20 >> 0x20);
        local_1c8.elemsize._0_4_ = (int)sVar26;
        local_1c8.elemsize._4_4_ = (undefined4)(sVar26 >> 0x20);
        local_1c8.dims = (int)uVar30;
        local_1c8.w = (int)((ulong)uVar30 >> 0x20);
        local_1c8.h = (int)uVar31;
        local_1c8.d = (int)((ulong)uVar31 >> 0x20);
        if (!bVar29) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_1c8.allocator == (Allocator *)0x0) {
LAB_004dfdd7:
              if (local_1c8.data != (void *)0x0) {
                free(local_1c8.data);
              }
            }
            else {
              (*(local_1c8.allocator)->_vptr_Allocator[3])(local_1c8.allocator,local_1c8.data);
            }
          }
        }
      }
    }
    else {
      bVar29 = true;
      if (lVar22 == 0x90) {
        local_1c8.data = pMVar1[1].data;
        piVar20 = pMVar1[1].refcount;
        sVar26 = pMVar1[1].elemsize;
        local_1c8.elempack = pMVar1[1].elempack;
        local_1c8.allocator = pMVar1[1].allocator;
        uVar30._0_4_ = pMVar1[1].dims;
        uVar30._4_4_ = pMVar1[1].w;
        uVar31._0_4_ = pMVar1[1].h;
        uVar31._4_4_ = pMVar1[1].d;
        local_1c8.c = pMVar1[1].c;
        local_1c8.cstep = pMVar1[1].cstep;
        if (piVar20 == (int *)0x0) {
          piVar20 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
          bVar29 = false;
        }
      }
      else {
        local_1c8.cstep = 0;
        local_1c8.c = 0;
        local_1c8.allocator = (Allocator *)0x0;
        local_1c8.elempack = 0;
        sVar26 = 0;
        piVar20 = (int *)0x0;
        local_1c8.data = (void *)0x0;
      }
      local_1c8.refcount._0_4_ = SUB84(piVar20,0);
      local_1c8.refcount._4_4_ = (uint)((ulong)piVar20 >> 0x20);
      local_1c8.elemsize._0_4_ = (int)sVar26;
      local_1c8.elemsize._4_4_ = (undefined4)(sVar26 >> 0x20);
      local_1c8.dims = (int)uVar30;
      local_1c8.w = (int)((ulong)uVar30 >> 0x20);
      local_1c8.h = (int)uVar31;
      local_1c8.d = (int)((ulong)uVar31 >> 0x20);
      if (!bVar29) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) goto LAB_004dfdd7;
          (*(local_1c8.allocator)->_vptr_Allocator[3])(local_1c8.allocator,local_1c8.data);
        }
      }
    }
    broadcast_type_C = 0;
    if ((local_1c8.data != (void *)0x0) && ((long)local_1c8.c * local_1c8.cstep != 0)) {
      if (local_1c8.dims == 1) {
        broadcast_type_C = 4;
        if (local_1c8.w * local_1c8.elempack != uVar24) {
          broadcast_type_C = (uint)(local_1c8.w * local_1c8.elempack == uVar9);
        }
      }
      else {
        bVar29 = local_1c8.dims == 2;
        broadcast_type_C = 0;
        if (local_1c8.w == 1U && bVar29) {
          broadcast_type_C = (uint)(local_1c8.elempack * local_1c8.h == uVar9) * 2;
        }
        if ((local_1c8.w == 1U && bVar29 || bVar29) && (local_1c8.w == uVar24)) {
          if (local_1c8.elempack * local_1c8.h == uVar9) {
            broadcast_type_C = 3;
          }
          if (local_1c8.elempack * local_1c8.h == 1) {
            broadcast_type_C = 4;
          }
        }
      }
      if ((this->super_Gemm).beta != 1.0) {
        local_158.cstep = 0;
        local_158.data = (void *)0x0;
        local_158.refcount._0_4_ = 0;
        local_158.refcount._4_4_ = 0;
        local_158.elemsize._0_4_ = 0;
        local_158.elemsize._4_4_ = 0;
        local_158.elempack = 0;
        local_158.allocator = (Allocator *)0x0;
        local_158.dims = 0;
        local_158.d = 0;
        local_158.c = 0;
        local_158.w = local_158.refcount._4_4_;
        local_158.h = (int)local_158.elemsize;
        Mat::create_like(&local_158,&local_1c8,opt->workspace_allocator);
        uVar21 = local_1c8.c * (int)local_1c8.cstep * local_1c8.elempack;
        if (0 < (int)uVar21) {
          uVar18 = 0;
          do {
            *(float *)((long)local_158.data + uVar18 * 4) =
                 (this->super_Gemm).beta * *(float *)((long)local_1c8.data + uVar18 * 4);
            uVar18 = uVar18 + 1;
          } while (uVar21 != uVar18);
        }
        piVar20 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
        }
        piVar20 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_1c8.allocator == (Allocator *)0x0) {
              if (local_1c8.data != (void *)0x0) {
                free(local_1c8.data);
              }
            }
            else {
              (*(local_1c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        local_1c8.data = local_158.data;
        local_1c8.refcount._0_4_ = local_158.refcount._0_4_;
        local_1c8.refcount._4_4_ = local_158.refcount._4_4_;
        local_1c8.elemsize._0_4_ = (int)local_158.elemsize;
        local_1c8.elemsize._4_4_ = local_158.elemsize._4_4_;
        local_1c8.elempack = local_158.elempack;
        local_1c8.allocator = local_158.allocator;
        local_1c8.dims = local_158.dims;
        local_1c8.w = local_158.w;
        local_1c8.h = local_158.h;
        local_1c8.d = local_158.d;
        local_1c8.c = local_158.c;
        local_1c8.cstep = local_158.cstep;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              if (local_158.data != (void *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  else {
    if (&local_1c8 != &this->CT_data) {
      piVar20 = (this->CT_data).refcount;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + 1;
        UNLOCK();
      }
      local_1c8.data = (this->CT_data).data;
      piVar20 = (this->CT_data).refcount;
      local_1c8.refcount._0_4_ = SUB84(piVar20,0);
      local_1c8.refcount._4_4_ = (uint)((ulong)piVar20 >> 0x20);
      sVar26 = (this->CT_data).elemsize;
      local_1c8.elemsize._0_4_ = (int)sVar26;
      local_1c8.elemsize._4_4_ = (undefined4)(sVar26 >> 0x20);
      local_1c8.elempack = (this->CT_data).elempack;
      local_1c8.allocator = (this->CT_data).allocator;
      uVar4 = (this->CT_data).dims;
      uVar5 = (this->CT_data).w;
      uVar6 = (this->CT_data).h;
      uVar7 = (this->CT_data).d;
      local_1c8.c = (this->CT_data).c;
      local_1c8.cstep = (this->CT_data).cstep;
      local_1c8.dims = uVar4;
      local_1c8.w = uVar5;
      local_1c8.h = uVar6;
      local_1c8.d = uVar7;
    }
    broadcast_type_C = (this->super_Gemm).constant_broadcast_type_C;
  }
  iVar8 = (this->super_Gemm).output_transpose;
  uVar18 = 1;
  if (opt->use_packing_layout == true) {
    uVar21 = uVar24;
    if (iVar8 == 0) {
      uVar21 = uVar9;
    }
    uVar18 = 8;
    if ((uVar21 & 7) != 0) {
      uVar18 = (ulong)((uVar21 & 3) == 0) * 3 + 1;
    }
  }
  uVar21 = (this->super_Gemm).output_elempack;
  if (uVar21 != 0) {
    uVar18 = (ulong)uVar21;
  }
  iVar12 = (int)uVar18;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar21 = uVar24;
  if (iVar8 != 0) {
    uVar21 = uVar9;
    uVar9 = uVar24;
  }
  if ((this->super_Gemm).output_N1M == 0) {
    Mat::create(this_00,uVar21,(int)uVar9 / iVar12,(ulong)(uint)(iVar12 * 4),iVar12,
                opt->blob_allocator);
  }
  else {
    Mat::create(this_00,uVar21,1,(int)uVar9 / iVar12,(ulong)(uint)(iVar12 * 4),iVar12,
                opt->blob_allocator);
  }
  iVar8 = -100;
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_004dfbb7;
  iVar8 = *(int *)&(this->super_Gemm).field_0x244;
  iVar12 = iVar8;
  if (iVar8 == 0) {
    iVar12 = opt->num_threads;
  }
  if (opt->num_threads != iVar8 && iVar8 != 0) {
    forward();
  }
  iVar8 = (this->super_Gemm).constantA;
  iVar27 = (this->super_Gemm).constantB;
  local_90 = uVar18;
  if (iVar27 == 0 || iVar8 == 0) {
    pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (iVar8 == 0) {
      if (iVar27 == 0) {
        iVar8 = gemm_x86(pMVar16,pMVar16 + 1,&local_1c8,this_00,broadcast_type_C,
                         (this->super_Gemm).transA,(this->super_Gemm).transB,
                         (this->super_Gemm).output_transpose,(this->super_Gemm).constant_TILE_M,
                         (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,
                         iVar12,opt);
        iVar12 = (int)local_90;
        goto LAB_004dfbb2;
      }
      iVar8 = (this->super_Gemm).transA;
      iVar27 = (this->super_Gemm).constantN;
      iVar10 = (this->super_Gemm).constantK;
      local_1d0 = CONCAT44(local_1d0._4_4_,iVar8);
      if (iVar8 == 0) {
        iVar8 = pMVar16->elempack * (&pMVar16->h)[(ulong)(pMVar16->dims == 3) * 2];
      }
      else {
        iVar8 = pMVar16->w;
      }
      local_180 = CONCAT44(local_180._4_4_,(this->super_Gemm).output_transpose);
      get_optimal_tile_mnk
                (iVar8,iVar27,iVar10,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,iVar12);
      local_38 = (ulong)(uint)TILE_M;
      local_98 = CONCAT44(local_98._4_4_,(iVar8 + TILE_M + -1) / TILE_M);
      local_1d8 = (ulong)(uint)TILE_K;
      local_158.cstep = 0;
      local_158.data = (void *)0x0;
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.elemsize._0_4_ = 0;
      local_158.elemsize._4_4_ = 0;
      local_158.elempack = 0;
      local_158.allocator = (Allocator *)0x0;
      local_158.dims = 0;
      local_158.w = 0;
      local_158.h = 0;
      local_158.d = 0;
      local_158.c = 0;
      Mat::create(&local_158,TILE_K * TILE_M,(iVar10 + TILE_K + -1) / TILE_K,iVar12,4,
                  opt->workspace_allocator);
      iVar8 = -100;
      if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0)) {
        local_f8.cstep = 0;
        local_f8.data = (Mat *)0x0;
        local_f8.refcount._0_4_ = 0;
        local_f8.refcount._4_4_ = 0;
        local_f8.elemsize._0_4_ = 0;
        local_f8.elemsize._4_4_ = 0;
        local_f8.elempack = 0;
        local_f8.allocator = (Allocator *)0x0;
        local_f8.dims = 0;
        local_f8.w = 0;
        local_f8.h = 0;
        local_f8.d = 0;
        local_f8.c = 0;
        if (((int)local_180 == 0) && ((broadcast_type_C != 3 && (iVar10 <= (int)local_1d8)))) {
LAB_004df482:
          if ((int)(uint)local_98 < 1) {
            iVar8 = 0;
          }
          else {
            local_178 = CONCAT71(local_178._1_7_,(int)local_180 == 0);
            local_a8 = 0;
            local_a0 = (Mat *)CONCAT44(local_a0._4_4_,iVar27);
            local_108 = CONCAT44(local_108._4_4_,TILE_N);
            uVar18 = local_1d8;
            uVar9 = TILE_N;
            do {
              if ((int)local_1d0 == 0) {
                iVar8 = pMVar16->elempack * (&pMVar16->h)[(ulong)(pMVar16->dims == 3) * 2];
                iVar12 = pMVar16->w;
              }
              else {
                iVar8 = pMVar16->w;
                iVar12 = pMVar16->elempack * (&pMVar16->h)[(ulong)(pMVar16->dims == 3) * 2];
              }
              iVar10 = (int)local_38 * (int)local_a8;
              local_1e0 = (ulong)(uint)(iVar8 - iVar10);
              if ((int)local_38 < iVar8 - iVar10) {
                local_1e0 = local_38 & 0xffffffff;
              }
              local_48 = 0;
              _TILE_M_2 = (Mat *)0x0;
              uStack_80 = 0;
              uStack_7c = 0;
              local_78 = 0;
              uStack_74 = 0;
              local_70 = 0;
              iStack_58 = 0;
              uStack_54._0_4_ = 0;
              uStack_54._4_4_ = 0;
              local_68 = (Allocator *)0x0;
              iStack_60 = 0;
              uStack_5c = 0;
              if ((((int)local_180 != 0) || (broadcast_type_C == 3)) || ((int)uVar18 < iVar12)) {
                iVar8 = get_omp_thread_num();
                uVar25 = CONCAT44(local_f8.elemsize._4_4_,(int)local_f8.elemsize);
                local_48 = ((long)local_f8.w * (long)local_f8.h * uVar25 + 0xf & 0xfffffffffffffff0)
                           / uVar25;
                if (local_f8.dims == 4) {
                  local_48 = (long)local_f8.w * (long)local_f8.h;
                }
                iStack_60 = local_f8.dims + -1;
                _TILE_M_2 = (Mat *)((long)(void **)local_f8.data +
                                   (long)iVar8 * uVar25 * local_f8.cstep);
                local_78 = (int)local_f8.elemsize;
                uStack_74 = local_f8.elemsize._4_4_;
                local_70 = local_f8.elempack;
                local_68 = local_f8.allocator;
                uStack_5c = local_f8.w;
                iStack_58 = local_f8.h;
                uStack_54._4_4_ = local_f8.d;
                uStack_54._0_4_ = 1;
              }
              uStack_7c = 0;
              uStack_80 = 0;
              local_170 = _TILE_M_2;
              if (0 < iVar27) {
                iVar8 = 0;
                do {
                  uVar25 = local_1e0;
                  uVar24 = iVar27 - iVar8;
                  if ((int)uVar9 < iVar27 - iVar8) {
                    uVar24 = uVar9;
                  }
                  local_160 = (ulong)uVar24;
                  local_168 = &local_1c8;
                  if (broadcast_type_C == 3) {
                    pack_A_tile(&local_1c8,local_170,iVar10,(int)local_1e0,iVar8,uVar24);
                    local_168 = (Mat *)&TILE_M_2;
                  }
                  if (0 < iVar12) {
                    iVar27 = iVar12;
                    iVar19 = 0;
                    do {
                      iVar11 = (int)uVar18;
                      iVar15 = iVar27;
                      if (iVar11 < iVar27) {
                        iVar15 = iVar11;
                      }
                      iVar13 = get_omp_thread_num();
                      pMVar17 = (Mat *)((long)local_158.data +
                                       (long)local_158.w *
                                       CONCAT44(local_158.elemsize._4_4_,(int)local_158.elemsize) *
                                       (long)(iVar19 / iVar11) +
                                       (long)iVar13 * local_158.cstep *
                                       CONCAT44(local_158.elemsize._4_4_,(int)local_158.elemsize));
                      iVar23 = iVar8 / (int)(uint)local_108;
                      iVar13 = (this->BT_data).w;
                      sVar26 = (this->BT_data).cstep;
                      sVar2 = (this->BT_data).elemsize;
                      pvVar3 = (this->BT_data).data;
                      if (iVar8 == 0) {
                        if ((int)local_1d0 == 0) {
                          pack_A_tile(pMVar16,pMVar17,iVar10,(int)local_1e0,iVar19,iVar15);
                          uVar18 = local_1d8;
                        }
                        else {
                          transpose_pack_A_tile(pMVar16,pMVar17,iVar10,(int)local_1e0,iVar19,iVar15)
                          ;
                          uVar18 = local_1d8;
                        }
                      }
                      uVar25 = local_1e0;
                      iVar28 = iVar19 + (int)uVar18;
                      gemm_transB_packed_tile
                                (pMVar17,(Mat *)((long)pvVar3 +
                                                (long)iVar13 * sVar2 * (long)(iVar19 / iVar11) +
                                                (long)iVar23 * sVar26 * sVar2),local_168,local_170,
                                 this_00,broadcast_type_C,iVar10,(int)local_1e0,iVar8,(int)local_160
                                 ,iVar19,iVar15,(bool)(iVar12 <= iVar28 & (byte)local_178));
                      iVar27 = iVar27 - (int)uVar18;
                      iVar19 = iVar28;
                    } while (iVar28 < iVar12);
                  }
                  if ((int)local_180 != 0) {
                    transpose_unpack_output_tile
                              (local_170,this_00,iVar10,(int)uVar25,iVar8,(int)local_160);
                  }
                  iVar8 = iVar8 + (uint)local_108;
                  iVar27 = (int)local_a0;
                  uVar9 = (uint)local_108;
                } while (iVar8 < (int)local_a0);
              }
              uVar24 = (int)local_a8 + 1;
              local_a8 = (ulong)uVar24;
            } while (uVar24 != (uint)local_98);
            iVar8 = 0;
          }
        }
        else {
          Mat::create(&local_f8,TILE_N * (int)local_38,1,iVar12,4,opt->workspace_allocator);
          iVar8 = -100;
          if (((Mat *)local_f8.data != (Mat *)0x0) && ((long)local_f8.c * local_f8.cstep != 0))
          goto LAB_004df482;
        }
        piVar20 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_f8.allocator == (Allocator *)0x0) {
              if ((Mat *)local_f8.data != (Mat *)0x0) {
                free(local_f8.data);
              }
            }
            else {
              (*(local_f8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar20 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      iVar12 = (int)local_90;
      if (piVar20 == (int *)0x0) goto LAB_004dfbb2;
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 != 0) goto LAB_004dfbb2;
      if (local_158.allocator != (Allocator *)0x0) {
        (*(local_158.allocator)->_vptr_Allocator[3])();
        goto LAB_004dfbb2;
      }
      if (local_158.data == (void *)0x0) goto LAB_004dfbb2;
LAB_004dfbaa:
      free(local_158.data);
    }
    else {
      iVar27 = (this->super_Gemm).transB;
      uVar9 = (this->super_Gemm).constantM;
      pMVar17 = (Mat *)(ulong)uVar9;
      uVar24 = (this->super_Gemm).constantK;
      if (iVar27 == 0) {
        uVar21 = pMVar16->w;
      }
      else {
        uVar21 = pMVar16->elempack * (&pMVar16->h)[(ulong)(pMVar16->dims == 3) * 2];
      }
      local_1d0 = (ulong)uVar21;
      local_1d8 = CONCAT44(local_1d8._4_4_,(this->super_Gemm).output_transpose);
      get_optimal_tile_mnk
                (uVar9,uVar21,uVar24,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,iVar12);
      local_180 = (ulong)(uint)TILE_M;
      uVar9 = (int)(TILE_M + uVar9 + -1) / TILE_M;
      local_178 = (ulong)(uint)TILE_N;
      iVar19 = ((int)local_1d0 + TILE_N + -1) / TILE_N;
      iVar10 = (int)((uVar24 - 1) + TILE_K) / TILE_K;
      local_158.cstep = 0;
      local_158.data = (void *)0x0;
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.elemsize._0_4_ = 0;
      local_158.elemsize._4_4_ = 0;
      local_158.elempack = 0;
      local_158.allocator = (Allocator *)0x0;
      local_158.dims = 0;
      local_158.w = 0;
      local_158.h = 0;
      local_158.d = 0;
      local_158.c = 0;
      Mat::create(&local_158,TILE_K * TILE_N,iVar10,iVar19,4,opt->workspace_allocator);
      iVar8 = -100;
      local_a0 = pMVar17;
      if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0)) {
        iVar19 = iVar19 * iVar10;
        if (0 < iVar19) {
          iVar8 = 0;
          do {
            iVar13 = (int)local_178;
            iVar11 = (iVar8 / iVar10) * iVar13;
            iVar23 = (int)((long)iVar8 % (long)iVar10) * TILE_K;
            iVar15 = (int)local_1d0 - iVar11;
            if (iVar13 < iVar15) {
              iVar15 = iVar13;
            }
            iVar13 = uVar24 - iVar23;
            if (TILE_K < (int)(uVar24 - iVar23)) {
              iVar13 = TILE_K;
            }
            pMVar17 = (Mat *)((long)local_158.data +
                             ((long)iVar8 % (long)iVar10 & 0xffffffffU) * (long)local_158.w *
                             CONCAT44(local_158.elemsize._4_4_,(int)local_158.elemsize) +
                             (long)(iVar8 / iVar10) * local_158.cstep *
                             CONCAT44(local_158.elemsize._4_4_,(int)local_158.elemsize));
            if (iVar27 == 0) {
              transpose_pack_B_tile(pMVar16,pMVar17,iVar11,iVar15,iVar23,iVar13);
            }
            else {
              pack_B_tile(pMVar16,pMVar17,iVar11,iVar15,iVar23,iVar13);
            }
            iVar8 = iVar8 + 1;
          } while (iVar19 != iVar8);
        }
        uVar25 = local_178;
        uVar18 = local_1d0;
        local_f8.cstep = 0;
        local_a8 = CONCAT71(local_a8._1_7_,
                            (int)local_1d8 != 0 || (broadcast_type_C == 3 || TILE_K < (int)uVar24));
        local_f8.data = (Mat *)0x0;
        local_f8.refcount._0_4_ = 0;
        local_f8.refcount._4_4_ = 0;
        local_f8.elemsize._0_4_ = 0;
        local_f8.elemsize._4_4_ = 0;
        local_f8.elempack = 0;
        local_f8.allocator = (Allocator *)0x0;
        local_f8.dims = 0;
        local_f8.w = 0;
        local_f8.h = 0;
        local_f8.d = 0;
        local_f8.c = 0;
        if ((int)local_1d8 != 0 || (broadcast_type_C == 3 || TILE_K < (int)uVar24)) {
          Mat::create(&local_f8,(int)local_178 * (int)local_180,1,iVar12,4,opt->workspace_allocator)
          ;
          iVar8 = -100;
          if (((Mat *)local_f8.data != (Mat *)0x0) && ((long)local_f8.c * local_f8.cstep != 0))
          goto LAB_004ded5b;
        }
        else {
LAB_004ded5b:
          if (0 < (int)uVar9) {
            bVar29 = (int)local_1d8 == 0;
            local_98 = (ulong)uVar9;
            uVar14 = 0;
            local_168 = (Mat *)(ulong)(uint)TILE_K;
            do {
              iVar8 = (int)local_180 * (int)uVar14;
              uVar9 = (int)local_a0 - iVar8;
              local_1e0 = (ulong)uVar9;
              if ((int)local_180 < (int)uVar9) {
                local_1e0 = local_180 & 0xffffffff;
              }
              local_48 = 0;
              _TILE_M_2 = (Mat *)0x0;
              uStack_80 = 0;
              uStack_7c = 0;
              local_78 = 0;
              uStack_74 = 0;
              local_70 = 0;
              iStack_58 = 0;
              uStack_54._0_4_ = 0;
              uStack_54._4_4_ = 0;
              local_68 = (Allocator *)0x0;
              iStack_60 = 0;
              uStack_5c = 0;
              local_160 = uVar14;
              if ((char)local_a8 != '\0') {
                iVar12 = get_omp_thread_num();
                uVar14 = CONCAT44(local_f8.elemsize._4_4_,(int)local_f8.elemsize);
                local_48 = ((long)local_f8.w * (long)local_f8.h * uVar14 + 0xf & 0xfffffffffffffff0)
                           / uVar14;
                if (local_f8.dims == 4) {
                  local_48 = (long)local_f8.w * (long)local_f8.h;
                }
                iStack_60 = local_f8.dims + -1;
                _TILE_M_2 = (Mat *)((long)(void **)local_f8.data +
                                   (long)iVar12 * uVar14 * local_f8.cstep);
                local_78 = (int)local_f8.elemsize;
                uStack_74 = local_f8.elemsize._4_4_;
                local_70 = local_f8.elempack;
                local_68 = local_f8.allocator;
                uStack_5c = local_f8.w;
                iStack_58 = local_f8.h;
                uStack_54._4_4_ = local_f8.d;
                uStack_54._0_4_ = 1;
              }
              pMVar16 = _TILE_M_2;
              uStack_7c = 0;
              uStack_80 = 0;
              if (0 < (int)uVar18) {
                iVar12 = 0;
                do {
                  iVar27 = (int)uVar18 - iVar12;
                  if ((int)uVar25 < iVar27) {
                    iVar27 = (int)uVar25;
                  }
                  pMVar17 = &local_1c8;
                  if (broadcast_type_C == 3) {
                    pack_A_tile(&local_1c8,pMVar16,iVar8,(int)local_1e0,iVar12,iVar27);
                    pMVar17 = (Mat *)&TILE_M_2;
                  }
                  if (0 < (int)uVar24) {
                    local_108 = (long)(iVar12 / (int)local_178);
                    local_170 = pMVar17;
                    uVar9 = uVar24;
                    iVar10 = 0;
                    do {
                      iVar19 = (int)local_168;
                      pMVar17 = (Mat *)(ulong)uVar9;
                      if (iVar19 < (int)uVar9) {
                        pMVar17 = local_168;
                      }
                      uVar9 = -(iVar19 - uVar9);
                      sVar26 = (this->AT_data).elemsize;
                      iVar15 = iVar10 + iVar19;
                      gemm_transB_packed_tile
                                ((Mat *)((long)(this->AT_data).data +
                                        (long)(this->AT_data).w * sVar26 * (long)(iVar10 / iVar19) +
                                        (this->AT_data).cstep * local_160 * sVar26),
                                 (Mat *)((long)local_158.data +
                                        (long)local_158.w *
                                        CONCAT44(local_158.elemsize._4_4_,(int)local_158.elemsize) *
                                        (long)(iVar10 / iVar19) +
                                        local_158.cstep * local_108 *
                                        CONCAT44(local_158.elemsize._4_4_,(int)local_158.elemsize)),
                                 local_170,pMVar16,this_00,broadcast_type_C,iVar8,(int)local_1e0,
                                 iVar12,iVar27,iVar10,(int)pMVar17,(int)uVar24 <= iVar15 && bVar29);
                      iVar10 = iVar15;
                    } while (iVar15 < (int)uVar24);
                  }
                  if ((int)local_1d8 != 0) {
                    transpose_unpack_output_tile(pMVar16,this_00,iVar8,(int)local_1e0,iVar12,iVar27)
                    ;
                  }
                  iVar12 = iVar12 + (int)local_178;
                  uVar25 = local_178;
                  uVar18 = local_1d0;
                } while (iVar12 < (int)local_1d0);
              }
              uVar14 = local_160 + 1;
            } while (uVar14 != local_98);
          }
          iVar8 = 0;
        }
        piVar20 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_f8.allocator == (Allocator *)0x0) {
              if ((Mat *)local_f8.data != (Mat *)0x0) {
                free(local_f8.data);
              }
            }
            else {
              (*(local_f8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar20 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      iVar12 = (int)local_90;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 != 0) goto LAB_004dfbb2;
        if (local_158.allocator != (Allocator *)0x0) {
          (*(local_158.allocator)->_vptr_Allocator[3])();
          goto LAB_004dfbb2;
        }
joined_r0x004df2be:
        if (local_158.data != (void *)0x0) goto LAB_004dfbaa;
      }
    }
  }
  else {
    uVar9 = (this->super_Gemm).constantM;
    iVar8 = (this->super_Gemm).constantN;
    iVar27 = (this->super_Gemm).constantK;
    iVar10 = (this->super_Gemm).output_transpose;
    local_108 = CONCAT44(local_108._4_4_,iVar8);
    get_optimal_tile_mnk
              (uVar9,iVar8,iVar27,(this->super_Gemm).constant_TILE_M,
               (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M_2,
               &TILE_M,&TILE_N,iVar12);
    local_1d0 = (ulong)_TILE_M_2 & 0xffffffff;
    uVar18 = (long)(int)(uVar9 + TILE_M_2 + -1) / (long)TILE_M_2;
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    local_178 = CONCAT44(local_178._4_4_,iVar27);
    local_180 = CONCAT71(local_180._1_7_,iVar10 != 0 || (broadcast_type_C == 3 || TILE_N < iVar27));
    local_1d8 = (ulong)uVar9;
    if (iVar10 != 0 || (broadcast_type_C == 3 || TILE_N < iVar27)) {
      Mat::create(&local_158,TILE_M * TILE_M_2,1,iVar12,4,opt->workspace_allocator);
      iVar8 = -100;
      if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0))
      goto LAB_004de6d8;
    }
    else {
LAB_004de6d8:
      if (0 < (int)uVar18) {
        pMVar16 = (Mat *)0x0;
        uVar25 = local_178 & 0xffffffff;
        local_1e0 = CONCAT71(local_1e0._1_7_,iVar10 == 0);
        local_168 = (Mat *)CONCAT44(local_168._4_4_,TILE_M);
        iVar8 = (uint)local_108;
        local_a0 = (Mat *)(uVar18 & 0xffffffff);
        do {
          iVar27 = (int)local_1d0;
          iVar19 = iVar27 * (int)pMVar16;
          iVar12 = (int)local_1d8 - iVar19;
          if (iVar27 < iVar12) {
            iVar12 = iVar27;
          }
          local_f8.cstep = 0;
          local_f8.data = (Mat *)0x0;
          local_f8.refcount._0_4_ = 0;
          local_f8.refcount._4_4_ = 0;
          local_f8.elemsize._0_4_ = 0;
          local_f8.elemsize._4_4_ = 0;
          local_f8.elempack = 0;
          local_f8.h = 0;
          local_f8.d = 0;
          local_f8.c = 0;
          local_f8.allocator = (Allocator *)0x0;
          local_f8.dims = 0;
          local_f8.w = 0;
          local_170 = pMVar16;
          if ((char)local_180 != '\0') {
            iVar27 = get_omp_thread_num();
            uVar18 = CONCAT44(local_158.elemsize._4_4_,(int)local_158.elemsize);
            local_f8.cstep =
                 ((long)local_158.w * (long)local_158.h * uVar18 + 0xf & 0xfffffffffffffff0) /
                 uVar18;
            if (local_158.dims == 4) {
              local_f8.cstep = (long)local_158.w * (long)local_158.h;
            }
            local_f8.dims = local_158.dims + -1;
            local_f8.data = (void *)((long)iVar27 * uVar18 * local_158.cstep + (long)local_158.data)
            ;
            local_f8.elemsize._0_4_ = (int)local_158.elemsize;
            local_f8.elemsize._4_4_ = local_158.elemsize._4_4_;
            local_f8.elempack = local_158.elempack;
            local_f8.allocator = local_158.allocator;
            local_f8.w = local_158.w;
            local_f8.h = local_158.h;
            local_f8.c = local_158.d;
            local_f8.d = 1;
          }
          pvVar3 = local_f8.data;
          local_f8.refcount._4_4_ = 0;
          local_f8.refcount._0_4_ = 0;
          if (0 < iVar8) {
            iVar27 = 0;
            do {
              iVar15 = iVar8 - iVar27;
              if ((int)local_168 < iVar8 - iVar27) {
                iVar15 = (int)local_168;
              }
              pMVar16 = &local_1c8;
              if (broadcast_type_C == 3) {
                pack_A_tile(&local_1c8,(Mat *)pvVar3,iVar19,iVar12,iVar27,iVar15);
                pMVar16 = &local_f8;
              }
              pMVar17 = local_170;
              iVar8 = (int)uVar25;
              if (0 < iVar8) {
                local_160 = (ulong)(iVar27 / (int)local_168);
                iVar11 = 0;
                do {
                  iVar23 = (int)uVar25;
                  iVar13 = iVar23;
                  if (TILE_N < iVar23) {
                    iVar13 = TILE_N;
                  }
                  sVar26 = (this->AT_data).elemsize;
                  sVar2 = (this->BT_data).elemsize;
                  iVar28 = iVar11 + TILE_N;
                  gemm_transB_packed_tile
                            ((Mat *)((long)(this->AT_data).data +
                                    (long)(this->AT_data).w * sVar26 * (long)(iVar11 / TILE_N) +
                                    (this->AT_data).cstep * (long)pMVar17 * sVar26),
                             (Mat *)((long)(this->BT_data).data +
                                    (long)(this->BT_data).w * sVar2 * (long)(iVar11 / TILE_N) +
                                    (this->BT_data).cstep * local_160 * sVar2),pMVar16,(Mat *)pvVar3
                             ,this_00,broadcast_type_C,iVar19,iVar12,iVar27,iVar15,iVar11,iVar13,
                             (bool)(iVar8 <= iVar28 & (byte)local_1e0));
                  uVar25 = (ulong)(uint)-(TILE_N - iVar23);
                  iVar11 = iVar28;
                } while (iVar28 < iVar8);
              }
              if (iVar10 != 0) {
                transpose_unpack_output_tile((Mat *)pvVar3,this_00,iVar19,iVar12,iVar27,iVar15);
              }
              iVar27 = iVar27 + (int)local_168;
              uVar25 = local_178 & 0xffffffff;
              iVar8 = (uint)local_108;
            } while (iVar27 < (int)(uint)local_108);
          }
          pMVar16 = (Mat *)((long)&local_170->data + 1);
        } while (pMVar16 != local_a0);
      }
      iVar8 = 0;
    }
    piVar20 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    iVar12 = (int)local_90;
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_158.allocator == (Allocator *)0x0) goto joined_r0x004df2be;
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_004dfbb2:
  if (iVar8 == 0) {
    iVar8 = 0;
    if (((this->super_Gemm).alpha != 1.0) &&
       (uVar9 = iVar12 * (int)this_00->cstep * this_00->c, iVar8 = 0, 0 < (int)uVar9)) {
      pvVar3 = this_00->data;
      iVar8 = 0;
      uVar18 = 0;
      do {
        *(float *)((long)pvVar3 + uVar18 * 4) =
             *(float *)((long)pvVar3 + uVar18 * 4) * (this->super_Gemm).alpha;
        uVar18 = uVar18 + 1;
      } while (uVar9 != uVar18);
    }
  }
LAB_004dfbb7:
  piVar20 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
  if (piVar20 != (int *)0x0) {
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 == 0) {
      if (local_1c8.allocator == (Allocator *)0x0) {
        if (local_1c8.data != (void *)0x0) {
          free(local_1c8.data);
        }
      }
      else {
        (*(local_1c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar8;
}

Assistant:

int Gemm_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        // return Gemm::forward_int8(bottom_blobs, top_blobs, opt);
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif

    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    if (ret != 0)
        return ret;

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return 0;
}